

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O0

void emulate_arith3i(int code,reg_type *dest,reg_type *src1,long imm)

{
  uint uVar1;
  byte bVar2;
  long imm_local;
  reg_type *src1_local;
  reg_type *dest_local;
  int code_local;
  
  bVar2 = (byte)imm;
  uVar1 = (uint)imm;
  switch(code) {
  case 0:
    (dest->u).i.i = (src1->u).i.i + uVar1;
    break;
  case 1:
    (dest->u).i.i = (src1->u).i.i + uVar1;
    break;
  case 2:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + imm);
    break;
  case 3:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + imm);
    break;
  case 4:
    (dest->u).i.i = (src1->u).i.i - uVar1;
    break;
  case 5:
    (dest->u).i.i = (src1->u).i.i - uVar1;
    break;
  case 6:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - imm);
    break;
  case 7:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - imm);
    break;
  case 8:
    *(uint *)&dest->u = *(int *)&src1->u * uVar1;
    break;
  case 9:
    *(uint *)&dest->u = *(int *)&src1->u * uVar1;
    break;
  case 10:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u * imm);
    break;
  case 0xb:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u * imm);
    break;
  case 0xc:
    *(int *)&dest->u = *(int *)&src1->u / (int)uVar1;
    break;
  case 0xd:
    (dest->u).i.i = (int)((ulong)(uint)(src1->u).i.i / (imm & 0xffffffffU));
    break;
  case 0xe:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u / (ulong)imm);
    break;
  case 0xf:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u / imm);
    break;
  case 0x10:
    *(int *)&dest->u = *(int *)&src1->u % (int)uVar1;
    break;
  case 0x11:
    (dest->u).i.i = (int)((ulong)(uint)(src1->u).i.i % (imm & 0xffffffffU));
    break;
  case 0x12:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u % (ulong)imm);
    break;
  case 0x13:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u % imm);
    break;
  case 0x14:
    (dest->u).i.i = (src1->u).i.i ^ uVar1;
    break;
  case 0x15:
    (dest->u).i.i = (src1->u).i.i ^ uVar1;
    break;
  case 0x16:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u ^ imm);
    break;
  case 0x17:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u ^ imm);
    break;
  case 0x18:
    (dest->u).i.i = (src1->u).i.i & uVar1;
    break;
  case 0x19:
    (dest->u).i.i = (src1->u).i.i & uVar1;
    break;
  case 0x1a:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u & imm);
    break;
  case 0x1b:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u & imm);
    break;
  case 0x1c:
    (dest->u).i.i = (src1->u).i.i | uVar1;
    break;
  case 0x1d:
    (dest->u).i.i = (src1->u).i.i | uVar1;
    break;
  case 0x1e:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u | imm);
    break;
  case 0x1f:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u | imm);
    break;
  case 0x20:
    (dest->u).i.i = (src1->u).i.i << (bVar2 & 0x1f);
    break;
  case 0x21:
    (dest->u).i.i = (src1->u).i.i << (bVar2 & 0x1f);
    break;
  case 0x22:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << (bVar2 & 0x3f));
    break;
  case 0x23:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << (bVar2 & 0x3f));
    break;
  case 0x24:
    (dest->u).i.i = (src1->u).i.i >> (bVar2 & 0x1f);
    break;
  case 0x25:
    (dest->u).i.i = (uint)(src1->u).i.i >> (bVar2 & 0x1f);
    break;
  case 0x26:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u >> (bVar2 & 0x3f));
    break;
  case 0x27:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u >> (bVar2 & 0x3f));
    break;
  case 0x28:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + imm);
    break;
  case 0x29:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - imm);
  }
  return;
}

Assistant:

void emulate_arith3i(int code, struct reg_type *dest, struct reg_type *src1, IMM_TYPE imm)
{
    switch(code) {
	  case dill_jmp_addi:  dest->u.i.i =  src1->u.i.i + (int) imm; break;
	  case dill_jmp_addu:  dest->u.u.u =  src1->u.u.u + (unsigned int) imm; break;
	  case dill_jmp_addul:  dest->u.ul.ul =  src1->u.ul.ul +  imm; break;
	  case dill_jmp_addl:  dest->u.l.l =  src1->u.l.l +  imm; break;
	  case dill_jmp_addp:  dest->u.p.p = (char*) src1->u.p.p +  imm; break;
	  case dill_jmp_subi:  dest->u.i.i =  src1->u.i.i - (int) imm; break;
	  case dill_jmp_subu:  dest->u.u.u =  src1->u.u.u - (unsigned int) imm; break;
	  case dill_jmp_subul:  dest->u.ul.ul =  src1->u.ul.ul -  imm; break;
	  case dill_jmp_subl:  dest->u.l.l =  src1->u.l.l -  imm; break;
	  case dill_jmp_subp:  dest->u.p.p = (char*) src1->u.p.p -  imm; break;
	  case dill_jmp_mulu:  dest->u.u.u =  src1->u.u.u * (unsigned int) imm; break;
	  case dill_jmp_mulul:  dest->u.ul.ul =  src1->u.ul.ul *  imm; break;
	  case dill_jmp_muli:  dest->u.i.i =  src1->u.i.i * (int) imm; break;
	  case dill_jmp_mull:  dest->u.l.l =  src1->u.l.l *  imm; break;
	  case dill_jmp_divu:  dest->u.u.u =  src1->u.u.u / (unsigned int) imm; break;
	  case dill_jmp_divul:  dest->u.ul.ul =  src1->u.ul.ul /  imm; break;
	  case dill_jmp_divi:  dest->u.i.i =  src1->u.i.i / (int) imm; break;
	  case dill_jmp_divl:  dest->u.l.l =  src1->u.l.l /  imm; break;
	  case dill_jmp_modu:  dest->u.u.u =  src1->u.u.u % (unsigned int) imm; break;
	  case dill_jmp_modul:  dest->u.ul.ul =  src1->u.ul.ul %  imm; break;
	  case dill_jmp_modi:  dest->u.i.i =  src1->u.i.i % (int) imm; break;
	  case dill_jmp_modl:  dest->u.l.l =  src1->u.l.l %  imm; break;
	  case dill_jmp_andi:  dest->u.i.i =  src1->u.i.i & (int) imm; break;
	  case dill_jmp_andu:  dest->u.u.u =  src1->u.u.u & (unsigned int) imm; break;
	  case dill_jmp_andul:  dest->u.ul.ul =  src1->u.ul.ul &  imm; break;
	  case dill_jmp_andl:  dest->u.l.l =  src1->u.l.l &  imm; break;
	  case dill_jmp_ori:  dest->u.i.i =  src1->u.i.i | (int) imm; break;
	  case dill_jmp_oru:  dest->u.u.u =  src1->u.u.u | (unsigned int) imm; break;
	  case dill_jmp_orul:  dest->u.ul.ul =  src1->u.ul.ul |  imm; break;
	  case dill_jmp_orl:  dest->u.l.l =  src1->u.l.l |  imm; break;
	  case dill_jmp_xori:  dest->u.i.i =  src1->u.i.i ^ (int) imm; break;
	  case dill_jmp_xoru:  dest->u.u.u =  src1->u.u.u ^ (unsigned int) imm; break;
	  case dill_jmp_xorul:  dest->u.ul.ul =  src1->u.ul.ul ^  imm; break;
	  case dill_jmp_xorl:  dest->u.l.l =  src1->u.l.l ^  imm; break;
	  case dill_jmp_lshi:  dest->u.i.i =  src1->u.i.i << (int) imm; break;
	  case dill_jmp_lshu:  dest->u.u.u =  src1->u.u.u << (unsigned int) imm; break;
	  case dill_jmp_lshul:  dest->u.ul.ul =  src1->u.ul.ul <<  imm; break;
	  case dill_jmp_lshl:  dest->u.l.l =  src1->u.l.l <<  imm; break;
	  case dill_jmp_rshi:  dest->u.i.i =  src1->u.i.i >> (int) imm; break;
	  case dill_jmp_rshu:  dest->u.u.u =  src1->u.u.u >> (unsigned int) imm; break;
	  case dill_jmp_rshul:  dest->u.ul.ul =  src1->u.ul.ul >>  imm; break;
	  case dill_jmp_rshl:  dest->u.l.l =  src1->u.l.l >>  imm; break;
    }
}